

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

ZSTD_compressionParameters *
ZSTD_getCParamsFromCCtxParams
          (ZSTD_compressionParameters *__return_storage_ptr__,ZSTD_CCtx_params *CCtxParams,
          U64 srcSizeHint,size_t dictSize,ZSTD_cParamMode_e mode)

{
  ZSTD_compressionParameters cPar;
  ZSTD_compressionParameters local_50;
  
  if (srcSizeHint == 0xffffffffffffffff) {
    srcSizeHint = 0xffffffffffffffff;
    if (0 < (long)CCtxParams->srcSizeHint) {
      srcSizeHint = (long)CCtxParams->srcSizeHint;
    }
  }
  ZSTD_getCParams_internal(&local_50,CCtxParams->compressionLevel,srcSizeHint,dictSize,mode);
  if ((CCtxParams->ldmParams).enableLdm == ZSTD_ps_enable) {
    local_50.windowLog = 0x1b;
  }
  ZSTD_overrideCParams(&local_50,&CCtxParams->cParams);
  if ((((0xffffffe9 < local_50.windowLog - 0x20) && (0xffffffe6 < local_50.chainLog - 0x1f)) &&
      (0xffffffe6 < local_50.hashLog - 0x1f)) &&
     (((0xffffffe1 < local_50.searchLog - 0x1f && (0xfffffffa < local_50.minMatch - 8)) &&
      ((local_50.targetLength < 0x20001 && (local_50.strategy - ZSTD_fast < 9)))))) {
    cPar.chainLog = local_50.chainLog;
    cPar.windowLog = local_50.windowLog;
    cPar.strategy = local_50.strategy;
    cPar.targetLength = local_50.targetLength;
    cPar.hashLog = local_50.hashLog;
    cPar.searchLog = local_50.searchLog;
    cPar.minMatch = local_50.minMatch;
    ZSTD_adjustCParams_internal
              (__return_storage_ptr__,cPar,srcSizeHint,dictSize,mode,CCtxParams->useRowMatchFinder);
    return __return_storage_ptr__;
  }
  __assert_fail("!ZSTD_checkCParams(cParams)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x56f1,
                "ZSTD_compressionParameters ZSTD_getCParamsFromCCtxParams(const ZSTD_CCtx_params *, U64, size_t, ZSTD_cParamMode_e)"
               );
}

Assistant:

ZSTD_compressionParameters ZSTD_getCParamsFromCCtxParams(
        const ZSTD_CCtx_params* CCtxParams, U64 srcSizeHint, size_t dictSize, ZSTD_cParamMode_e mode)
{
    ZSTD_compressionParameters cParams;
    if (srcSizeHint == ZSTD_CONTENTSIZE_UNKNOWN && CCtxParams->srcSizeHint > 0) {
      srcSizeHint = CCtxParams->srcSizeHint;
    }
    cParams = ZSTD_getCParams_internal(CCtxParams->compressionLevel, srcSizeHint, dictSize, mode);
    if (CCtxParams->ldmParams.enableLdm == ZSTD_ps_enable) cParams.windowLog = ZSTD_LDM_DEFAULT_WINDOW_LOG;
    ZSTD_overrideCParams(&cParams, &CCtxParams->cParams);
    assert(!ZSTD_checkCParams(cParams));
    /* srcSizeHint == 0 means 0 */
    return ZSTD_adjustCParams_internal(cParams, srcSizeHint, dictSize, mode, CCtxParams->useRowMatchFinder);
}